

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

int mpz_cmp_ui(__mpz_struct *u,unsigned_long v)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = u->_mp_size;
  iVar2 = 1;
  if (iVar1 < 2) {
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *u->_mp_d;
      }
      if (iVar1 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *u->_mp_d;
      }
      return (uint)(v < uVar4) - (uint)(uVar3 < v);
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
mpz_cmp_ui (const mpz_t u, unsigned long v)
{
  mp_size_t usize = u->_mp_size;

  if (usize > 1)
    return 1;
  else if (usize < 0)
    return -1;
  else
    return GMP_CMP (mpz_get_ui (u), v);
}